

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O0

void nn_xpush_out(nn_sockbase *self,nn_pipe *pipe)

{
  int increment;
  nn_lb_data *data_00;
  nn_sockbase *local_30;
  nn_xpush_data *data;
  nn_xpush *xpush;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_30 = self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_sockbase *)0x0;
  }
  data_00 = (nn_lb_data *)nn_pipe_getdata(pipe);
  nn_lb_out((nn_lb *)(local_30 + 1),data_00);
  increment = nn_lb_get_priority((nn_lb *)(local_30 + 1));
  nn_sockbase_stat_increment(self,0x191,increment);
  return;
}

Assistant:

static void nn_xpush_out (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpush *xpush;
    struct nn_xpush_data *data;

    xpush = nn_cont (self, struct nn_xpush, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_lb_out (&xpush->lb, &data->lb);
    nn_sockbase_stat_increment (self, NN_STAT_CURRENT_SND_PRIORITY,
        nn_lb_get_priority (&xpush->lb));
}